

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_1::drawTessCoordPoint
               (Surface *dst,TessPrimitiveType primitiveType,Vec3 *pt,RGBA *color,int size)

{
  int iVar1;
  void *pvVar2;
  int width;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  bool bVar11;
  float fVar12;
  float fVar13;
  int height;
  Vector<float,_2> local_58 [2];
  Vector<float,_2> local_48;
  Vector<float,_2> local_40;
  Vector<float,_2> local_38;
  
  if (Functional::(anonymous_namespace)::
      drawTessCoordPoint(tcu::Surface&,deqp::gles31::Functional::(anonymous_namespace)::TessPrimitiveType,tcu::Vector<float,int>const&,tcu::RGBA_const&,int)
      ::triangleCorners == '\0') {
    iVar3 = __cxa_guard_acquire(&Functional::(anonymous_namespace)::
                                 drawTessCoordPoint(tcu::Surface&,deqp::gles31::Functional::(anonymous_namespace)::TessPrimitiveType,tcu::Vector<float,int>const&,tcu::RGBA_const&,int)
                                 ::triangleCorners);
    if (iVar3 != 0) {
      drawTessCoordPoint::triangleCorners[0].m_data = (float  [2])0x3f7333333f733333;
      drawTessCoordPoint::triangleCorners[1].m_data[0] = 0.5;
      drawTessCoordPoint::triangleCorners[1].m_data[1] = 0.17057715;
      drawTessCoordPoint::triangleCorners[2].m_data[0] = 0.05;
      drawTessCoordPoint::triangleCorners[2].m_data[1] = 0.95;
      __cxa_guard_release(&Functional::(anonymous_namespace)::
                           drawTessCoordPoint(tcu::Surface&,deqp::gles31::Functional::(anonymous_namespace)::TessPrimitiveType,tcu::Vector<float,int>const&,tcu::RGBA_const&,int)
                           ::triangleCorners);
    }
  }
  if (primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
    tcu::operator*(pt->m_data[0],drawTessCoordPoint::triangleCorners);
    tcu::operator*(pt->m_data[1],drawTessCoordPoint::triangleCorners + 1);
    tcu::operator+(&local_38,&local_40);
    tcu::operator*(pt->m_data[2],drawTessCoordPoint::triangleCorners + 2);
    tcu::operator+(local_58,&local_48);
    fVar12 = local_58[1].m_data[0];
    fVar13 = local_58[1].m_data[1];
  }
  else if (primitiveType < TESSPRIMITIVETYPE_LAST) {
    fVar12 = (float)*(undefined8 *)pt->m_data;
    fVar13 = (float)((ulong)*(undefined8 *)pt->m_data >> 0x20);
    fVar12 = (1.0 - fVar12) * 0.1 + fVar12 * 0.9;
    fVar13 = (1.0 - fVar13) * 0.9 + fVar13 * 0.1;
  }
  else {
    fVar12 = -1.0;
    fVar13 = -1.0;
  }
  iVar3 = dst->m_width;
  iVar1 = dst->m_height;
  iVar5 = (int)(fVar13 * (float)iVar1);
  uVar7 = size - 1U >> 1;
  iVar6 = iVar5 - uVar7;
  for (iVar8 = -uVar7; iVar8 != ((uint)size >> 1) + 1; iVar8 = iVar8 + 1) {
    iVar9 = iVar8 + iVar5;
    pvVar2 = (dst->m_pixels).m_ptr;
    iVar4 = ((uint)size >> 1) + uVar7 + 1;
    iVar10 = (int)((float)iVar3 * fVar12) - uVar7;
    while (bVar11 = iVar4 != 0, iVar4 = iVar4 + -1, bVar11) {
      if ((iVar10 < iVar3 && -1 < iVar10) && (iVar9 < iVar1 && -1 < iVar9)) {
        *(deUint32 *)((long)pvVar2 + (long)(dst->m_width * iVar6 + iVar10) * 4) = color->m_value;
      }
      iVar10 = iVar10 + 1;
    }
    iVar6 = iVar6 + 1;
  }
  return;
}

Assistant:

static void drawTessCoordPoint (tcu::Surface& dst, TessPrimitiveType primitiveType, const Vec3& pt, const tcu::RGBA& color, int size)
{
	// \note These coordinates should match the description in the log message in TessCoordCase::iterate.

	static const Vec2 triangleCorners[3] =
	{
		Vec2(0.95f, 0.95f),
		Vec2(0.5f,  0.95f - 0.9f*deFloatSqrt(3.0f/4.0f)),
		Vec2(0.05f, 0.95f)
	};

	static const float quadIsolineLDRU[4] =
	{
		0.1f, 0.9f, 0.9f, 0.1f
	};

	const Vec2 dstPos = primitiveType == TESSPRIMITIVETYPE_TRIANGLES ? pt.x()*triangleCorners[0]
																	 + pt.y()*triangleCorners[1]
																	 + pt.z()*triangleCorners[2]

					  : primitiveType == TESSPRIMITIVETYPE_QUADS ||
						primitiveType == TESSPRIMITIVETYPE_ISOLINES ? Vec2((1.0f - pt.x())*quadIsolineLDRU[0] + pt.x()*quadIsolineLDRU[2],
																		   (1.0f - pt.y())*quadIsolineLDRU[1] + pt.y()*quadIsolineLDRU[3])

					  : Vec2(-1.0f);

	drawPoint(dst, (int)(dstPos.x() * (float)dst.getWidth()), (int)(dstPos.y() * (float)dst.getHeight()), color, size);
}